

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_socket.cpp
# Opt level: O1

int setReceiveBufferSize(SOCKET sockfd,int size)

{
  int iVar1;
  int optval;
  socklen_t optval_size;
  undefined8 local_18;
  
  local_18 = CONCAT44(4,size);
  iVar1 = setsockopt(sockfd,1,8,&local_18,4);
  if (iVar1 == -1) {
    LogMessage(1,"%s: setting receive buffer size failed");
  }
  iVar1 = getsockopt(sockfd,1,8,&local_18,(socklen_t *)((long)&local_18 + 4));
  if (iVar1 == -1) {
    LogMessage(1,"%s: getting receive buffer size failed");
  }
  iVar1 = 0;
  if ((int)local_18 != size) {
    LogMessage(2,"%s, ReceiveBuffer size is %d, but set %d","int setReceiveBufferSize(SOCKET, int)",
               local_18 & 0xffffffff,size);
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int setReceiveBufferSize(SOCKET sockfd, int size)
{
  // Large 1MB Buffer for receiving so we don't lose data.
  int optval = size;
  socklen_t optval_size = sizeof(int);
  if (setsockopt(sockfd, SOL_SOCKET, SO_RCVBUF, (char *) &optval,
             optval_size) == SOCKET_ERROR) {
    LogMessage(VL_Error, "%s: setting receive buffer size failed");
  }
  if (getsockopt(sockfd, SOL_SOCKET, SO_RCVBUF, (char *) &optval,
             &optval_size) == SOCKET_ERROR) {
    LogMessage(VL_Error, "%s: getting receive buffer size failed");
  }
  if (optval != size) {
    LogMessage(VL_Warning,
               "%s, ReceiveBuffer size is %d, but set %d", __PRETTY_FUNCTION__, optval, size);
    return RC_Unrecognized;
  }
  return RC_Okay;
}